

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl.cpp
# Opt level: O1

void ImGui_ImplSDL2_NewFrame(SDL_Window *window)

{
  ImFontAtlas *pIVar1;
  byte bVar2;
  bool bVar3;
  char cVar4;
  short sVar5;
  ImGuiMouseCursor IVar6;
  int iVar7;
  ImGuiIO *pIVar8;
  Uint64 UVar9;
  SDL_Window *pSVar10;
  long lVar11;
  SDL_Cursor *pSVar12;
  undefined8 uVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int display_h;
  int display_w;
  int my;
  int mx;
  int h;
  int w;
  int wx;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  
  pIVar8 = ImGui::GetIO();
  pIVar1 = pIVar8->Fonts;
  if ((0 < (pIVar1->Fonts).Size) &&
     ((pIVar1->TexPixelsAlpha8 != (uchar *)0x0 || (pIVar1->TexPixelsRGBA32 != (uint *)0x0)))) {
    SDL_GetWindowSize(window,&local_34,&local_38);
    SDL_GL_GetDrawableSize(window,&local_44,&local_48);
    (pIVar8->DisplaySize).x = (float)local_34;
    (pIVar8->DisplaySize).y = (float)local_38;
    if (0 < local_38 && 0 < local_34) {
      (pIVar8->DisplayFramebufferScale).x = (float)local_44 / (float)local_34;
      (pIVar8->DisplayFramebufferScale).y = (float)local_48 / (float)local_38;
    }
    if (ImGui_ImplSDL2_NewFrame(SDL_Window*)::frequency == '\0') {
      iVar7 = __cxa_guard_acquire(&ImGui_ImplSDL2_NewFrame(SDL_Window*)::frequency);
      if (iVar7 != 0) {
        ImGui_ImplSDL2_NewFrame::frequency = SDL_GetPerformanceFrequency();
        __cxa_guard_release(&ImGui_ImplSDL2_NewFrame(SDL_Window*)::frequency);
      }
    }
    UVar9 = SDL_GetPerformanceCounter();
    if (g_Time == 0) {
      fVar14 = 0.016666668;
    }
    else {
      lVar11 = UVar9 - g_Time;
      auVar16._8_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar16._0_8_ = lVar11;
      auVar16._12_4_ = 0x45300000;
      auVar17._8_4_ = (int)(ImGui_ImplSDL2_NewFrame::frequency >> 0x20);
      auVar17._0_8_ = ImGui_ImplSDL2_NewFrame::frequency;
      auVar17._12_4_ = 0x45300000;
      fVar14 = (float)(((auVar16._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) /
                      ((auVar17._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)ImGui_ImplSDL2_NewFrame::frequency) -
                      4503599627370496.0)));
    }
    pIVar8->DeltaTime = fVar14;
    g_Time = UVar9;
    pIVar8 = ImGui::GetIO();
    if (pIVar8->WantSetMousePos == true) {
      SDL_WarpMouseInWindow(g_Window,(int)(pIVar8->MousePos).x,(int)(pIVar8->MousePos).y);
    }
    else {
      (pIVar8->MousePos).x = -3.4028235e+38;
      (pIVar8->MousePos).y = -3.4028235e+38;
    }
    bVar2 = SDL_GetMouseState(&local_3c,&local_40);
    pIVar8->MouseDown[0] = (bool)((_ZL14g_MousePressed_0 | bVar2) & 1);
    pIVar8->MouseDown[1] = (bool)((bVar2 >> 2 | _ZL14g_MousePressed_1) & 1);
    pIVar8->MouseDown[2] = (bool)((bVar2 >> 1 | _ZL14g_MousePressed_2) & 1);
    _ZL14g_MousePressed_2 = 0;
    _ZL14g_MousePressed_1 = 0;
    _ZL14g_MousePressed_0 = 0;
    pSVar10 = (SDL_Window *)SDL_GetKeyboardFocus();
    if (g_Window == pSVar10) {
      SDL_GetWindowPosition(pSVar10,&local_2c,&local_30);
      SDL_GetGlobalMouseState(&local_3c,&local_40);
      local_3c = local_3c - local_2c;
      local_40 = local_40 - local_30;
      (pIVar8->MousePos).x = (float)local_3c;
      (pIVar8->MousePos).y = (float)local_40;
    }
    bVar3 = ImGui::IsAnyMouseDown();
    SDL_CaptureMouse(bVar3);
    pIVar8 = ImGui::GetIO();
    if ((pIVar8->ConfigFlags & 0x20) == 0) {
      IVar6 = ImGui::GetMouseCursor();
      uVar13 = 0;
      if ((IVar6 != -1) && (pIVar8->MouseDrawCursor == false)) {
        pSVar12 = g_MouseCursors[IVar6];
        if (g_MouseCursors[IVar6] == (SDL_Cursor *)0x0) {
          pSVar12 = g_MouseCursors[0];
        }
        SDL_SetCursor(pSVar12);
        uVar13 = 1;
      }
      SDL_ShowCursor(uVar13);
    }
    pIVar8 = ImGui::GetIO();
    pIVar8->NavInputs[0] = 0.0;
    pIVar8->NavInputs[1] = 0.0;
    pIVar8->NavInputs[2] = 0.0;
    pIVar8->NavInputs[3] = 0.0;
    pIVar8->NavInputs[4] = 0.0;
    pIVar8->NavInputs[5] = 0.0;
    pIVar8->NavInputs[6] = 0.0;
    pIVar8->NavInputs[7] = 0.0;
    pIVar8->NavInputs[8] = 0.0;
    pIVar8->NavInputs[9] = 0.0;
    pIVar8->NavInputs[10] = 0.0;
    pIVar8->NavInputs[0xb] = 0.0;
    pIVar8->NavInputs[0xc] = 0.0;
    pIVar8->NavInputs[0xd] = 0.0;
    pIVar8->NavInputs[0xe] = 0.0;
    pIVar8->NavInputs[0xf] = 0.0;
    pIVar8->NavInputs[0x10] = 0.0;
    pIVar8->NavInputs[0x11] = 0.0;
    pIVar8->NavInputs[0x12] = 0.0;
    pIVar8->NavInputs[0x13] = 0.0;
    pIVar8->NavInputs[0x14] = 0.0;
    pIVar8->NavInputs[0x15] = 0.0;
    if ((pIVar8->ConfigFlags & 2) != 0) {
      lVar11 = SDL_GameControllerOpen(0);
      if (lVar11 == 0) {
        *(byte *)&pIVar8->BackendFlags = (byte)pIVar8->BackendFlags & 0xfe;
      }
      else {
        cVar4 = SDL_GameControllerGetButton(lVar11,0);
        fVar14 = 0.0;
        if (cVar4 != '\0') {
          fVar14 = 1.0;
        }
        pIVar8->NavInputs[0] = fVar14;
        cVar4 = SDL_GameControllerGetButton(lVar11,1);
        fVar14 = 0.0;
        if (cVar4 != '\0') {
          fVar14 = 1.0;
        }
        pIVar8->NavInputs[1] = fVar14;
        cVar4 = SDL_GameControllerGetButton(lVar11,2);
        fVar14 = 0.0;
        if (cVar4 != '\0') {
          fVar14 = 1.0;
        }
        pIVar8->NavInputs[3] = fVar14;
        cVar4 = SDL_GameControllerGetButton(lVar11,3);
        fVar14 = 0.0;
        if (cVar4 != '\0') {
          fVar14 = 1.0;
        }
        pIVar8->NavInputs[2] = fVar14;
        cVar4 = SDL_GameControllerGetButton(lVar11,0xd);
        fVar14 = 0.0;
        if (cVar4 != '\0') {
          fVar14 = 1.0;
        }
        pIVar8->NavInputs[4] = fVar14;
        cVar4 = SDL_GameControllerGetButton(lVar11,0xe);
        fVar14 = 0.0;
        if (cVar4 != '\0') {
          fVar14 = 1.0;
        }
        pIVar8->NavInputs[5] = fVar14;
        cVar4 = SDL_GameControllerGetButton(lVar11,0xb);
        fVar14 = 0.0;
        if (cVar4 != '\0') {
          fVar14 = 1.0;
        }
        pIVar8->NavInputs[6] = fVar14;
        cVar4 = SDL_GameControllerGetButton(lVar11,0xc);
        fVar14 = 0.0;
        if (cVar4 != '\0') {
          fVar14 = 1.0;
        }
        pIVar8->NavInputs[7] = fVar14;
        cVar4 = SDL_GameControllerGetButton(lVar11,9);
        fVar14 = 0.0;
        if (cVar4 != '\0') {
          fVar14 = 1.0;
        }
        pIVar8->NavInputs[0xc] = fVar14;
        cVar4 = SDL_GameControllerGetButton(lVar11,10);
        fVar14 = 0.0;
        if (cVar4 != '\0') {
          fVar14 = 1.0;
        }
        pIVar8->NavInputs[0xd] = fVar14;
        cVar4 = SDL_GameControllerGetButton(lVar11,9);
        fVar14 = 0.0;
        if (cVar4 != '\0') {
          fVar14 = 1.0;
        }
        pIVar8->NavInputs[0xe] = fVar14;
        cVar4 = SDL_GameControllerGetButton(lVar11,10);
        fVar14 = 0.0;
        if (cVar4 != '\0') {
          fVar14 = 1.0;
        }
        pIVar8->NavInputs[0xf] = fVar14;
        sVar5 = SDL_GameControllerGetAxis(lVar11,0);
        fVar15 = (float)(sVar5 + 8000) / -24768.0;
        fVar14 = 1.0;
        if (fVar15 <= 1.0) {
          fVar14 = fVar15;
        }
        if ((0.0 < fVar14) && (pIVar8->NavInputs[8] <= fVar14 && fVar14 != pIVar8->NavInputs[8])) {
          pIVar8->NavInputs[8] = fVar14;
        }
        sVar5 = SDL_GameControllerGetAxis(lVar11,0);
        fVar15 = (float)(sVar5 + -8000) / 24767.0;
        fVar14 = 1.0;
        if (fVar15 <= 1.0) {
          fVar14 = fVar15;
        }
        if ((0.0 < fVar14) && (pIVar8->NavInputs[9] <= fVar14 && fVar14 != pIVar8->NavInputs[9])) {
          pIVar8->NavInputs[9] = fVar14;
        }
        sVar5 = SDL_GameControllerGetAxis(lVar11,1);
        fVar15 = (float)(sVar5 + 8000) / -24767.0;
        fVar14 = 1.0;
        if (fVar15 <= 1.0) {
          fVar14 = fVar15;
        }
        if ((0.0 < fVar14) && (pIVar8->NavInputs[10] <= fVar14 && fVar14 != pIVar8->NavInputs[10]))
        {
          pIVar8->NavInputs[10] = fVar14;
        }
        sVar5 = SDL_GameControllerGetAxis(lVar11,1);
        fVar15 = (float)(sVar5 + -8000) / 24767.0;
        fVar14 = 1.0;
        if (fVar15 <= 1.0) {
          fVar14 = fVar15;
        }
        if ((0.0 < fVar14) && (pIVar8->NavInputs[0xb] <= fVar14 && fVar14 != pIVar8->NavInputs[0xb])
           ) {
          pIVar8->NavInputs[0xb] = fVar14;
        }
        *(byte *)&pIVar8->BackendFlags = (byte)pIVar8->BackendFlags | 1;
      }
    }
    return;
  }
  __assert_fail("io.Fonts->IsBuilt() && \"Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/Green-Sky[P]imgui_entt_entity_editor_demo/external/imgui/impl/imgui_impl_sdl.cpp"
                ,0x143,"void ImGui_ImplSDL2_NewFrame(SDL_Window *)");
}

Assistant:

void ImGui_ImplSDL2_NewFrame(SDL_Window* window)
{
    ImGuiIO& io = ImGui::GetIO();
    IM_ASSERT(io.Fonts->IsBuilt() && "Font atlas not built! It is generally built by the renderer back-end. Missing call to renderer _NewFrame() function? e.g. ImGui_ImplOpenGL3_NewFrame().");

    // Setup display size (every frame to accommodate for window resizing)
    int w, h;
    int display_w, display_h;
    SDL_GetWindowSize(window, &w, &h);
    SDL_GL_GetDrawableSize(window, &display_w, &display_h);
    io.DisplaySize = ImVec2((float)w, (float)h);
    if (w > 0 && h > 0)
        io.DisplayFramebufferScale = ImVec2((float)display_w / w, (float)display_h / h);

    // Setup time step (we don't use SDL_GetTicks() because it is using millisecond resolution)
    static Uint64 frequency = SDL_GetPerformanceFrequency();
    Uint64 current_time = SDL_GetPerformanceCounter();
    io.DeltaTime = g_Time > 0 ? (float)((double)(current_time - g_Time) / frequency) : (float)(1.0f / 60.0f);
    g_Time = current_time;

    ImGui_ImplSDL2_UpdateMousePosAndButtons();
    ImGui_ImplSDL2_UpdateMouseCursor();

    // Update game controllers (if enabled and available)
    ImGui_ImplSDL2_UpdateGamepads();
}